

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears.c
# Opt level: O0

void key(GLFWwindow *window,int k,int s,int action,int mods)

{
  int mods_local;
  int action_local;
  int s_local;
  int k_local;
  GLFWwindow *window_local;
  
  if (action == 1) {
    if (k == 0x5a) {
      if ((mods & 1U) == 0) {
        view_rotz = view_rotz + 5.0;
      }
      else {
        view_rotz = view_rotz - 5.0;
      }
    }
    else if (k == 0x100) {
      glfwSetWindowShouldClose(window,1);
    }
    else if (k == 0x106) {
      view_roty = view_roty - 5.0;
    }
    else if (k == 0x107) {
      view_roty = view_roty + 5.0;
    }
    else if (k == 0x108) {
      view_rotx = view_rotx - 5.0;
    }
    else if (k == 0x109) {
      view_rotx = view_rotx + 5.0;
    }
  }
  return;
}

Assistant:

void key( GLFWwindow* window, int k, int s, int action, int mods )
{
  if( action != GLFW_PRESS ) return;

  switch (k) {
  case GLFW_KEY_Z:
    if( mods & GLFW_MOD_SHIFT )
      view_rotz -= 5.0;
    else
      view_rotz += 5.0;
    break;
  case GLFW_KEY_ESCAPE:
    glfwSetWindowShouldClose(window, GL_TRUE);
    break;
  case GLFW_KEY_UP:
    view_rotx += 5.0;
    break;
  case GLFW_KEY_DOWN:
    view_rotx -= 5.0;
    break;
  case GLFW_KEY_LEFT:
    view_roty += 5.0;
    break;
  case GLFW_KEY_RIGHT:
    view_roty -= 5.0;
    break;
  default:
    return;
  }
}